

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_element_level_up(MatroskaDemuxer *this)

{
  MatroskaLevel *level;
  int num;
  MatroskaDemuxer *this_local;
  
  level._4_4_ = 0;
  while ((0 < this->num_levels &&
         (this->levels[this->num_levels + -1].start + this->levels[this->num_levels + -1].length <=
          (this->super_IOContextDemuxer).m_processedBytes))) {
    this->num_levels = this->num_levels + -1;
    level._4_4_ = level._4_4_ + 1;
  }
  return level._4_4_;
}

Assistant:

int MatroskaDemuxer::ebml_read_element_level_up()
{
    // offset_t pos = url_ftell(pb);
    int num = 0;

    while (num_levels > 0)
    {
        const MatroskaLevel *level = &levels[num_levels - 1];

        if (m_processedBytes >= level->start + level->length)
        {
            num_levels--;
            num++;
        }
        else
        {
            break;
        }
    }

    return num;
}